

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O3

void visit_list_expr(gvisitor_t *self,gnode_list_expr_t *node)

{
  size_t sVar1;
  gnode_r *pgVar2;
  _Bool _Var3;
  gnode_literal_expr_t *v;
  gnode_t *node2;
  gnode_t *pgVar4;
  ulong uVar5;
  size_t k;
  ulong uVar6;
  
  if ((node->list1 != (gnode_r *)0x0) && (sVar1 = node->list1->n, sVar1 != 0)) {
    pgVar2 = node->list2;
    uVar5 = 0;
    do {
      if (uVar5 < node->list1->n) {
        pgVar4 = node->list1->p[uVar5];
      }
      else {
        pgVar4 = (gnode_t *)0x0;
      }
      gvisit(self,pgVar4);
      if (pgVar2 != (gnode_r *)0x0) {
        uVar6 = 0;
        do {
          if (uVar5 != uVar6) {
            if (uVar6 < node->list1->n) {
              node2 = node->list1->p[uVar6];
            }
            else {
              node2 = (gnode_t *)0x0;
            }
            _Var3 = gnode_is_equal(pgVar4,node2);
            if (_Var3) {
              _Var3 = gnode_is_literal_string(node2);
              if (_Var3) {
                report_error(self,GRAVITY_ERROR_SEMANTIC,node2,"Duplicated key %s in map.",
                             *(undefined8 *)&node2[1].block_length);
              }
              else {
                report_error(self,GRAVITY_ERROR_SEMANTIC,node2,"Duplicated key in map.");
              }
            }
          }
          uVar6 = uVar6 + 1;
        } while (sVar1 != uVar6);
        if (uVar5 < node->list2->n) {
          pgVar4 = node->list2->p[uVar5];
        }
        else {
          pgVar4 = (gnode_t *)0x0;
        }
        gvisit(self,pgVar4);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != sVar1);
  }
  return;
}

Assistant:

static void visit_list_expr (gvisitor_t *self, gnode_list_expr_t *node) {
    DEBUG_CODEGEN("visit_list_expr");
    DECLARE_CODE();

    CODEGEN_COUNT_REGISTERS(n1);

    bool     ismap = node->ismap;
    uint32_t n = (uint32_t)gnode_array_size(node->list1);

    // a map requires twice registers than a list
    uint32_t max_fields = (ismap) ? MAX_FIELDSxFLUSH : MAX_FIELDSxFLUSH*2;

    // destination register of a new instruction is ALWAYS a temp register
    // then the optimizer could decide to optimize and merge the step
    uint32_t dest = ircode_register_push_temp(code);
	ircode_add(code, (ismap) ? MAPNEW : LISTNEW, dest, n, 0, LINE_NUMBER(node));
    if (n == 0) return;

    // this is just like Lua "fields per flush"
    // basically nodes are processed in a finite chunk
    // and then added to the list/map
    uint32_t nloops = n / max_fields;
    if (n % max_fields != 0) ++nloops;
    uint32_t nprocessed = 0;

	ircode_pragma(code, PRAGMA_MOVE_OPTIMIZATION, 0, LINE_NUMBER(node));
    while (nprocessed < n) {
        size_t k = (n - nprocessed > max_fields) ? max_fields : (n - nprocessed);
        size_t idxstart = nprocessed;
        size_t idxend = nprocessed + k;
        nprocessed += (uint32_t)k;

        // check if this chunk can be optimized
        // if (check_literals_list(self, node, ismap, idxstart, idxend, dest)) continue;

        // save register context
        ircode_push_context(code);

        // process each node
        for (size_t i=1, j=idxstart; j<idxend; ++j) {
            gnode_t *e = gnode_array_get(node->list1, j);
            visit(e);
            uint32_t nreg = ircode_register_pop_context_protect(code, true);
            if ((nreg == REGISTER_ERROR) || ((nreg <= dest) && (ircode_register_istemp(code, nreg)))) {
                report_error(self, (gnode_t *)e, "Invalid list expression.");
                continue;
            }

            if (nreg != dest + i) {
                uint32_t temp_register = ircode_register_push_temp(code);
				ircode_add(code, MOVE, temp_register, nreg, 0, LINE_NUMBER(node));
                ircode_register_clear(code, nreg);
                uint32_t temp = ircode_register_pop_context_protect(code, true);
                if (temp == REGISTER_ERROR) {report_error(self, (gnode_t *)e, "Unexpected register error."); continue;}
                if (temp_register != dest + i) {report_error(self, (gnode_t *)e, "Unexpected register computation."); continue;}
            }

            if (ismap) {
                e = gnode_array_get(node->list2, j);
				ircode_pragma(code, PRAGMA_MOVE_OPTIMIZATION, 1, LINE_NUMBER(node));
                visit(e);
				ircode_pragma(code, PRAGMA_MOVE_OPTIMIZATION, 0, LINE_NUMBER(node));
                nreg = ircode_register_pop_context_protect(code, true);
                if ((nreg == REGISTER_ERROR) || ((nreg <= dest) && (ircode_register_istemp(code, nreg)))) {
                    report_error(self, (gnode_t *)e, "Invalid map expression.");
                    continue;
                }

                if (nreg != dest + i + 1) {
                    uint32_t temp_register = ircode_register_push_temp(code);
					ircode_add(code, MOVE, temp_register, nreg, 0, LINE_NUMBER(node));
                    ircode_register_clear(code, nreg);
                    uint32_t temp = ircode_register_pop_context_protect(code, true);
                    if (temp == REGISTER_ERROR) {report_error(self, (gnode_t *)e, "Unexpected register error."); continue;}
                    if (temp_register != dest + i + 1) {report_error(self, (gnode_t *)e, "Unexpected register computation."); continue;}
                }
            }

            i += (ismap) ? 2 : 1;
        }

        // emit proper SETLIST instruction
        // since in a map registers are always used in pairs (key, value) it is
        // extremely easier to just set reg1 to be always 0 and use r in a loop
		ircode_add(code, SETLIST, dest, (uint32_t)(idxend-idxstart), 0, LINE_NUMBER(node));

        // restore register context
        ircode_pop_context(code);
    }

	ircode_pragma(code, PRAGMA_MOVE_OPTIMIZATION, 1, LINE_NUMBER(node));
    CODEGEN_COUNT_REGISTERS(n2);
    CODEGEN_ASSERT_REGISTERS(n1, n2, 1);
}